

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O2

int __thiscall
bdConnectManager::requestConnection_direct
          (bdConnectManager *this,sockaddr_in *laddr,bdNodeId *target)

{
  list<bdProxyId,_std::allocator<bdProxyId>_> *this_00;
  int iVar1;
  int iVar2;
  mapped_type *this_01;
  _List_node_base *p_Var3;
  _Self __tmp;
  _List_node_base *p_Var4;
  _List_node_base *local_158;
  uchar auStack_150 [8];
  _List_node_base *local_148;
  _List_node_base *p_Stack_140;
  uchar local_138 [4];
  undefined8 local_134;
  list<bdId,_std::allocator<bdId>_> matchIds;
  list<bdId,_std::allocator<bdId>_> goodProxies;
  bdConnectionRequest connreq;
  
  bdConnectionRequest::bdConnectionRequest(&connreq);
  iVar1 = checkExistingConnectionAttempt(this,target);
  iVar2 = 0;
  if (iVar1 == 0) {
    bdConnectionRequest::setupDirectConnection(&connreq,laddr,target);
    goodProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node._M_size = 0;
    goodProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.super__List_node_base.
    _M_next = (_List_node_base *)&goodProxies;
    goodProxies.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.super__List_node_base.
    _M_prev = (_List_node_base *)&goodProxies;
    bdQueryManager::result(this->mQueryMgr,target,&goodProxies);
    this_00 = &connreq.mGoodProxies;
    p_Var3 = (_List_node_base *)&goodProxies;
    while (p_Var3 = (((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var3->_M_next)->_M_impl)._M_node
                    .super__List_node_base._M_next, p_Var3 != (_List_node_base *)&goodProxies) {
      local_138 = *(uchar (*) [4])&p_Var3[3]._M_next;
      local_158 = p_Var3[1]._M_next;
      auStack_150 = (uchar  [8])p_Var3[1]._M_prev;
      local_148 = p_Var3[2]._M_next;
      p_Stack_140 = p_Var3[2]._M_prev;
      local_134._0_4_ = 1;
      local_134._4_4_ = 0;
      std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::push_back
                (this_00,(value_type *)&local_158);
    }
    if (connreq.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl._M_node
        ._M_size == 0) {
      matchIds.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node._M_size = 0;
      matchIds.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.super__List_node_base.
      _M_next = (_List_node_base *)&matchIds;
      matchIds.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node.super__List_node_base.
      _M_prev = (_List_node_base *)&matchIds;
      bdSpace::find_node(this->mNodeSpace,target,10,&matchIds,0x200);
      p_Var3 = (_List_node_base *)&matchIds;
LAB_0011abfa:
      p_Var3 = (((_List_base<bdId,_std::allocator<bdId>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      if (p_Var3 != (_List_node_base *)&matchIds) {
        for (p_Var4 = connreq.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>.
                      _M_impl._M_node.super__List_node_base._M_next;
            p_Var4 != (_List_node_base *)this_00; p_Var4 = p_Var4->_M_next) {
          iVar2 = operator==((bdId *)(p_Var4 + 1),(bdId *)(p_Var3 + 1));
          if (iVar2 != 0) {
            if (p_Var4 != (_List_node_base *)this_00) goto LAB_0011abfa;
            break;
          }
        }
        local_138 = *(uchar (*) [4])&p_Var3[3]._M_next;
        local_158 = *(_List_node_base **)&((bdId *)(p_Var3 + 1))->addr;
        auStack_150 = (uchar  [8])p_Var3[1]._M_prev;
        local_148 = p_Var3[2]._M_next;
        p_Stack_140 = p_Var3[2]._M_prev;
        local_134._0_4_ = 5;
        local_134._4_4_ = 0;
        std::__cxx11::list<bdProxyId,_std::allocator<bdProxyId>_>::push_back
                  (this_00,(value_type *)&local_158);
        goto LAB_0011abfa;
      }
      std::__cxx11::_List_base<bdId,_std::allocator<bdId>_>::_M_clear
                (&matchIds.super__List_base<bdId,_std::allocator<bdId>_>);
    }
    if (1 < connreq.mGoodProxies.super__List_base<bdProxyId,_std::allocator<bdProxyId>_>._M_impl.
            _M_node._M_size) {
      std::operator<<((ostream *)&std::cerr,
                      "bdConnectManager::requestConnection_direct() ERROR Multiple Peers for DIRECT connection"
                     );
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    this_01 = std::
              map<bdNodeId,_bdConnectionRequest,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdConnectionRequest>_>_>
              ::operator[](&this->mConnectionRequests,target);
    bdConnectionRequest::operator=(this_01,&connreq);
    std::__cxx11::_List_base<bdId,_std::allocator<bdId>_>::_M_clear
              (&goodProxies.super__List_base<bdId,_std::allocator<bdId>_>);
    iVar2 = 1;
  }
  bdConnectionRequest::~bdConnectionRequest(&connreq);
  return iVar2;
}

Assistant:

int bdConnectManager::requestConnection_direct(struct sockaddr_in *laddr, bdNodeId *target) {

#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::requestConnection_direct()";
	std::cerr << std::endl;
#endif
	/* create a bdConnect, and put into the queue */
	bdConnectionRequest connreq;
	
	if (checkExistingConnectionAttempt(target)) {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::requestConnection_direct() Existing ConnectionRequest... NOOP";
		std::cerr << std::endl;
#endif
		return 0;
	}

	connreq.setupDirectConnection(laddr, target);

	std::list<bdId> goodProxies;
	std::list<bdId>::iterator pit;
	mQueryMgr->result(target, goodProxies);
	for (pit = goodProxies.begin(); pit != goodProxies.end(); pit++)
		connreq.mGoodProxies.push_back(bdProxyId(*pit, BD_PI_SRC_QUERYRESULT, 0));

	/* now look in the bdSpace as well */
	if (connreq.mGoodProxies.size() < MIN_START_DIRECT_COUNT) {
		int number = CONNECT_NUM_PROXY_ATTEMPTS;
		int with_flag = BITDHT_PEER_STATUS_DHT_ENGINE_VERSION;
		std::list<bdId> matchIds;
		std::list<bdId>::iterator it;
		std::list<bdProxyId>::iterator git;
		
		mNodeSpace->find_node(target, number, matchIds, with_flag);

		/* merge lists (costly should use sets or something) */
		for (it = matchIds.begin(); it != matchIds.end(); it++) {
			for (git = connreq.mGoodProxies.begin(); git != connreq.mGoodProxies.end(); git++)
				if (git->id == *it)
					break;
			if (git == connreq.mGoodProxies.end())
				connreq.mGoodProxies.push_back(bdProxyId(*it, BD_PI_SRC_NODESPACE_ENGINEVERSION, 0));
		}
	}

	/* Actually if we lots of ids at this point... its likely that something is wrong 
	 */

	if (connreq.mGoodProxies.size() > 1) {
		std::cerr << "bdConnectManager::requestConnection_direct() ERROR Multiple Peers for DIRECT connection";
		std::cerr << std::endl;
	}

#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::requestConnection_direct() CRINITSTATE Init Connection State";
	std::cerr << std::endl;
	std::cerr << connreq;
	std::cerr << std::endl;
#endif

	/* push connect onto queue, for later completion */

	mConnectionRequests[*target] = connreq;

	/* connection continued via iterator */
	return 1;
}